

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O1

xcb_rectangle_t monitor_clamp_client_rect(monitor *monitor,xcb_rectangle_t client_rect)

{
  ushort uVar1;
  xcb_rectangle_t xVar2;
  uint uVar3;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar4;
  
  uVar12 = (ulong)client_rect >> 0x30;
  xVar2 = monitor_get_offset_rect(monitor);
  uVar5 = (uint)client_rect.x;
  uVar6 = client_rect._0_4_ >> 0x10;
  uVar3 = client_rect._4_4_ & 0xffff;
  uVar4 = (ulong)uVar3;
  uVar1 = (monitor->offsets).left;
  uVar8 = (uint)uVar1;
  iVar9 = (uVar5 + uVar3) - (uint)uVar1;
  uVar1 = (monitor->offsets).top;
  uVar3 = (uint)uVar1;
  iVar7 = (uVar6 + client_rect.height) - (uint)uVar1;
  uVar11 = xVar2._4_4_ & 0xffff;
  iVar10 = iVar9 - uVar11;
  if (iVar10 == 0 || iVar9 < (int)uVar11) {
    uVar11 = uVar8;
    if ((int)uVar8 < (int)uVar5) {
      uVar11 = uVar5;
    }
  }
  else {
    iVar9 = (uVar8 - uVar5) + iVar10;
    uVar11 = uVar5 - iVar10;
    if (0 < iVar9) {
      uVar4 = (ulong)(client_rect._4_4_ - iVar9 & 0xffff);
      uVar11 = uVar8;
    }
  }
  iVar9 = iVar7 - (uint)xVar2.height;
  if (iVar9 == 0 || iVar7 < (int)(uint)xVar2.height) {
    if ((int)uVar3 < (int)uVar6) {
      uVar3 = uVar6;
    }
  }
  else {
    iVar10 = (uVar3 - uVar6) + iVar9;
    uVar5 = uVar6 - iVar9;
    iVar7 = 0;
    if (0 < iVar10) {
      uVar5 = uVar3;
      iVar7 = iVar10;
    }
    uVar12 = (ulong)((uint)client_rect.height - iVar7);
    uVar3 = uVar5;
  }
  return (xcb_rectangle_t)
         ((ulong)uVar11 & 0xffff | uVar4 << 0x20 | uVar12 << 0x30 | (ulong)(uVar3 << 0x10));
}

Assistant:

xcb_rectangle_t monitor_clamp_client_rect(const struct monitor *monitor,
                                          xcb_rectangle_t client_rect)
{
        xcb_rectangle_t monitor_rect = monitor_get_offset_rect(monitor);

        int32_t x = client_rect.x;
        int32_t y = client_rect.y;
        int32_t width = client_rect.width;
        int32_t height = client_rect.height;
        int32_t total_client_width = client_rect.x + client_rect.width - monitor->offsets.left;
        int32_t total_client_height = client_rect.y + client_rect.height - monitor->offsets.top;

        if (total_client_width > monitor_rect.width) {
                int32_t overflow = total_client_width - monitor_rect.width;
                int32_t subtract_from_width = overflow - (client_rect.x - monitor->offsets.left);

                // If we don't have enough x offset to account for the overflow
                // we need to mutate the width of the client to fit onto the
                // monitor
                if (subtract_from_width > 0) {
                        x = monitor->offsets.left;
                        width = client_rect.width - subtract_from_width;
                } else {
                        x = client_rect.x - overflow;
                }
        } else if (client_rect.x < monitor->offsets.left) {
                x = monitor->offsets.left;
        }

        if (total_client_height > monitor_rect.height) {
                int32_t overflow = total_client_height - monitor_rect.height;
                int32_t subtract_from_height = overflow - (client_rect.y - monitor->offsets.top);

                if (subtract_from_height > 0) {
                        y = monitor->offsets.top;
                        height = client_rect.height - subtract_from_height;
                } else {
                        y = client_rect.y - overflow;
                }
        } else if (client_rect.y < monitor->offsets.top) {
                y = monitor->offsets.top;
        }

        xcb_rectangle_t new_rect = {
                .x = (int16_t)x,
                .y = (int16_t)y,
                .width = (uint16_t)width,
                .height = (uint16_t)height,
        };

        return new_rect;
}